

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

bool __thiscall ctemplate::TemplateCache::Delete(TemplateCache *this,TemplateString *key)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  pair<unsigned_long,_int> *ppVar5;
  iterator iVar6;
  bool bVar7;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> to_erase;
  WriterMutexLock ml;
  pair<unsigned_long,_int> *local_48;
  iterator iStack_40;
  pair<unsigned_long,_int> *local_38;
  WriterMutexLock local_28;
  
  local_28.mu_ = this->mutex_;
  if ((((pthread_rwlock_t *)((long)local_28.mu_ + 0x38))->__size[0] == '\x01') &&
     (iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_28.mu_), iVar2 != 0)) {
    abort();
  }
  if (this->is_frozen_ == false) {
    local_48 = (pair<unsigned_long,_int> *)0x0;
    iStack_40._M_current = (pair<unsigned_long,_int> *)0x0;
    local_38 = (pair<unsigned_long,_int> *)0x0;
    p_Var3 = (_Hash_node_base *)TemplateString::GetGlobalId(key);
    p_Var4 = (this->parsed_template_cache_->_M_h)._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        if (p_Var4[1]._M_nxt == p_Var3) {
          RefcountedTemplate::DecRefN((RefcountedTemplate *)p_Var4[3]._M_nxt,1);
          if (iStack_40._M_current == local_38) {
            std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
            _M_realloc_insert<std::pair<unsigned_long,int>const&>
                      ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>
                        *)&local_48,iStack_40,(pair<unsigned_long,_int> *)(p_Var4 + 1));
          }
          else {
            p_Var1 = p_Var4[2]._M_nxt;
            (iStack_40._M_current)->first = ((pair<unsigned_long,_int> *)(p_Var4 + 1))->first;
            *(_Hash_node_base **)&(iStack_40._M_current)->second = p_Var1;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
      iVar6._M_current = iStack_40._M_current;
      ppVar5 = local_48;
      if (local_48 != iStack_40._M_current) {
        do {
          std::
          _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase(&this->parsed_template_cache_->_M_h,ppVar5);
          iVar6._M_current = ppVar5 + 1;
          ppVar5 = iVar6._M_current;
        } while (iVar6._M_current != iStack_40._M_current);
      }
      bVar7 = local_48 != iVar6._M_current;
      if (local_48 != (pair<unsigned_long,_int> *)0x0) {
        operator_delete(local_48);
      }
      goto LAB_0012207e;
    }
  }
  bVar7 = false;
LAB_0012207e:
  WriterMutexLock::~WriterMutexLock(&local_28);
  return bVar7;
}

Assistant:

bool TemplateCache::Delete(const TemplateString& key) {
  WriterMutexLock ml(mutex_);
  if (is_frozen_) {  // Cannot delete from a frozen cache.
    return false;
  }
  vector<TemplateCacheKey> to_erase;
  const TemplateId key_id = key.GetGlobalId();
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end();  ++it) {
    if (it->first.first == key_id) {
      // We'll delete the content pointed to by the entry here, since
      // it's handy, but we won't delete the entry itself quite yet.
      it->second.refcounted_tpl->DecRef();
      to_erase.push_back(it->first);
    }
  }
  for (vector<TemplateCacheKey>::iterator it = to_erase.begin();
       it != to_erase.end(); ++it) {
    parsed_template_cache_->erase(*it);
  }
  return !to_erase.empty();
}